

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall QSQLiteDriver::unsubscribeFromNotification(QSQLiteDriver *this,QString *name)

{
  bool bVar1;
  QSQLiteDriverPrivate *this_00;
  ulong uVar2;
  undefined8 uVar3;
  sqlite3 *in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QSQLiteDriverPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff68;
  CaseSensitivity in_stack_ffffffffffffff6c;
  bool local_69;
  char local_68 [32];
  char local_48 [32];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSQLiteDriver *)0x119e45);
  uVar2 = (**(code **)&((DataPointer *)&in_RDI->category)->d[6].super_QArrayData)();
  if ((uVar2 & 1) == 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcSqlite();
    anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x119eb0);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RSI,(char *)this_00,(int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (char *)0x119ec6);
      QMessageLogger::warning
                (local_48,"QSQLiteDriver::unsubscribeFromNotification: Database not open.");
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    local_69 = false;
  }
  else {
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)this_00,(QString *)in_RDI,
                       in_stack_ffffffffffffff6c);
    if (bVar1) {
      QList<QString>::removeAll<QString>
                ((QList<QString> *)in_RDI,
                 (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      bVar1 = QList<QString>::isEmpty((QList<QString> *)0x119fc7);
      if (bVar1) {
        sqlite3_update_hook(in_RSI,(_func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64 *)this_00
                            ,in_RDI);
      }
      local_69 = true;
    }
    else {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcSqlite();
      anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                (in_RDI,(QLoggingCategory *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x119f54);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RSI,(char *)this_00,(int)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (char *)0x119f6a);
        QtPrivate::asString((QString *)in_RSI);
        uVar3 = QString::utf16();
        QMessageLogger::warning
                  (local_68,"QSQLiteDriver::unsubscribeFromNotification: Not subscribed to \'%ls\'."
                   ,uVar3);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      local_69 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

bool QSQLiteDriver::unsubscribeFromNotification(const QString &name)
{
    Q_D(QSQLiteDriver);
    if (!isOpen()) {
        qCWarning(lcSqlite, "QSQLiteDriver::unsubscribeFromNotification: Database not open.");
        return false;
    }

    if (!d->notificationid.contains(name)) {
        qCWarning(lcSqlite, "QSQLiteDriver::unsubscribeFromNotification: Not subscribed to '%ls'.",
                  qUtf16Printable(name));
        return false;
    }

    d->notificationid.removeAll(name);
    if (d->notificationid.isEmpty())
        sqlite3_update_hook(d->access, nullptr, nullptr);

    return true;
}